

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O0

err_t bignIdVerify(bign_params *params,octet *oid_der,size_t oid_len,octet *id_hash,octet *hash,
                  octet *id_sig,octet *id_pubkey,octet *pubkey)

{
  ulong count;
  ulong n_00;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec_00;
  word *b;
  word *a;
  word *n_01;
  word wVar5;
  void *in_RCX;
  long in_RDX;
  octet *hash_00;
  void *in_RDI;
  void *in_R8;
  void *in_R9;
  octet *in_stack_00000008;
  octet *in_stack_00000010;
  octet *stack;
  octet *hash_state;
  word *t1;
  word *t;
  word *s1;
  word *s0;
  word *V;
  word *Q;
  word *R;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_fffffffffffffee8;
  bign_params *in_stack_fffffffffffffef0;
  word *pwVar6;
  word *in_stack_fffffffffffffef8;
  word *a_00;
  ec_o *in_stack_ffffffffffffff00;
  word *in_stack_ffffffffffffff08;
  word *in_stack_ffffffffffffff10;
  word *in_stack_ffffffffffffff18;
  bign_params *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  word *c;
  bign_deep_i in_stack_ffffffffffffff38;
  word *pwVar7;
  size_t in_stack_ffffffffffffff40;
  word *n_02;
  word *a_01;
  word *a_02;
  err_t local_24;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    local_24 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_fffffffffffffef0);
    if (bVar1 == 0) {
      local_24 = 0x1f6;
    }
    else {
      if ((in_RDX != -1) &&
         (sVar4 = oidFromDER((char *)in_stack_ffffffffffffff08,(octet *)in_stack_ffffffffffffff00,
                             (size_t)in_stack_fffffffffffffef8), sVar4 != 0xffffffffffffffff)) {
        bignStart_keep(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        ec_00 = (ec_o *)blobCreate((size_t)in_stack_fffffffffffffee8);
        if (ec_00 == (ec_o *)0x0) {
          return 0x6e;
        }
        eVar2 = bignStart(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        if (eVar2 != 0) {
          blobClose((blob_t)0x14d956);
          return eVar2;
        }
        count = ec_00->f->no;
        n_00 = ec_00->f->n;
        bVar1 = memIsValid(in_RCX,count);
        if ((((bVar1 == 0) || (bVar1 = memIsValid(in_R8,count), bVar1 == 0)) ||
            (bVar1 = memIsValid(in_R9,count + (count >> 1)), bVar1 == 0)) ||
           ((bVar1 = memIsValid(in_stack_00000008,count << 1), bVar1 == 0 ||
            (bVar1 = memIsValid(in_stack_00000010,count << 1), bVar1 == 0)))) {
          blobClose((blob_t)0x14da4c);
          return 0x6d;
        }
        b = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
        pwVar7 = b + n_00 * 2;
        a_00 = pwVar7 + n_00 * 2;
        a = a_00 + (n_00 >> 1) + 1;
        a_02 = a + n_00;
        a_01 = a_02 + (n_00 >> 1);
        c = a_01 + n_00 + 1;
        pwVar6 = c;
        sVar4 = beltHash_keep();
        n_01 = (word *)((long)c + sVar4);
        bVar1 = (*ec_00->f->from)(b,in_stack_00000008,ec_00->f,n_01);
        if ((bVar1 != 0) &&
           ((bVar1 = (*ec_00->f->from)(b + n_00,in_stack_00000008 + count,ec_00->f,n_01), bVar1 != 0
            && (bVar1 = ecpIsOnA(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffef8), bVar1 != 0)))) {
          bVar1 = (*ec_00->f->from)(pwVar7,in_stack_00000010,ec_00->f,n_01);
          if ((bVar1 == 0) ||
             (bVar1 = (*ec_00->f->from)(pwVar7 + n_00,in_stack_00000010 + count,ec_00->f,n_01),
             bVar1 == 0)) {
            blobClose((blob_t)0x14dcaa);
            return 0x1f9;
          }
          u64From(&in_stack_fffffffffffffef0->l,in_stack_fffffffffffffee8,0x14dce2);
          iVar3 = wwCmp(a,ec_00->order,n_00);
          if (-1 < iVar3) {
            blobClose((blob_t)0x14dd12);
            return 0x1fe;
          }
          u64From(&in_stack_fffffffffffffef0->l,in_stack_fffffffffffffee8,0x14dd3c);
          iVar3 = wwCmp(a_02,ec_00->order,n_00);
          if (-1 < iVar3) {
            zzSub2(a_02,ec_00->order,n_00);
          }
          zzAddMod(&in_stack_ffffffffffffff20->l,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                   ,in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
          u64From(&in_stack_fffffffffffffef0->l,in_stack_fffffffffffffee8,0x14ddc2);
          a_00[n_00 >> 1] = 1;
          beltHashStart(in_stack_fffffffffffffef0);
          beltHashStepH(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                        in_stack_fffffffffffffef0);
          pwVar7 = n_01;
          n_02 = pwVar6;
          beltHash_keep();
          memCopy(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0x14de2b);
          beltHashStepH(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                        in_stack_fffffffffffffef0);
          beltHashStepH(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                        in_stack_fffffffffffffef0);
          beltHashStepG2((octet *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef0);
          u64From(&in_stack_fffffffffffffef0->l,in_stack_fffffffffffffee8,0x14de93);
          zzMul(c,pwVar6,(size_t)n_01,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                in_stack_ffffffffffffff08);
          wVar5 = zzAdd2(a_01 + (n_00 >> 1),a_02,n_00 >> 1);
          a_01[n_00] = wVar5;
          wVar5 = zzAdd2(a_01 + (n_00 >> 1),a_00,n_00 >> 1);
          a_01[n_00] = wVar5 + a_01[n_00];
          a_01[n_00] = a_01[n_00] + 1;
          zzMod(a_02,a_01,(size_t)n_02,pwVar7,(size_t)c,pwVar6);
          zzNegMod((word *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   &in_stack_fffffffffffffef0->l,(size_t)in_stack_fffffffffffffee8);
          hash_00 = (octet *)((n_00 >> 1) + 1);
          pwVar6 = b;
          bVar1 = ecAddMulA(b,ec_00,pwVar7,3,ec_00->base,a,n_00);
          if (bVar1 == 0) {
            blobClose((blob_t)0x14e055);
            return 0x1fe;
          }
          (*ec_00->f->to)((octet *)b,b,ec_00->f,pwVar7);
          beltHashStepH(hash_00,(size_t)a_00,pwVar6);
          beltHashStepH(hash_00,(size_t)a_00,pwVar6);
          beltHashStepH(hash_00,(size_t)a_00,pwVar6);
          bVar1 = beltHashStepV2(hash_00,(size_t)a_00,pwVar6);
          eVar2 = 0x1fe;
          if (bVar1 != 0) {
            eVar2 = 0;
          }
          blobClose((blob_t)0x14e126);
          return eVar2;
        }
        blobClose((blob_t)0x14dc06);
        return 0x1f9;
      }
      local_24 = 0x12d;
    }
  }
  return local_24;
}

Assistant:

err_t bignIdVerify(const bign_params* params, const octet oid_der[], 
	size_t oid_len, const octet id_hash[], const octet hash[], 
	const octet id_sig[], const octet id_pubkey[], const octet pubkey[])
{
	err_t code;
	size_t no, n;
	// состояние (буферы R и V совпадают)
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */	
	word* R;			/* [2n] открытый ключ R */
	word* Q;			/* [2n] открытый ключ Q */
	word* V;			/* [2n] точка V (V == R) */
	word* s0;			/* [n / 2 + 1] первая часть подписи */
	word* s1;			/* [n] вторая часть подписи */
	word* t;			/* [n / 2] переменная t */
	word* t1;			/* [n + 1] произведение (s0 + 2^l)(t + 2^l) */
	octet* hash_state;	/* [beltHash_keep] состояние хэширования */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignIdVerify_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(id_hash, no) ||
		!memIsValid(hash, no) ||
		!memIsValid(id_sig, no + no / 2) ||
		!memIsValid(id_pubkey, 2 * no) ||
		!memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	R = V = objEnd(ec, word);
	Q = R + 2 * n;
	s0 = Q + 2 * n;
	s1 = s0 + n / 2 + 1;
	t = s1 + n;
	t1 = t + n / 2;
	hash_state = (octet*)(t1 + n + 1);
	stack = hash_state + beltHash_keep();
	// загрузить R
	if (!qrFrom(ecX(R), id_pubkey, ec->f, stack) ||
		!qrFrom(ecY(R, n), id_pubkey + no, ec->f, stack) ||
		!ecpIsOnA(R, ec, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить и проверить s1
	wwFrom(s1, id_sig + no / 2, no);
	if (wwCmp(s1, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	// s1 <- (s1 + H) mod q
	wwFrom(t, hash, no);
	if (wwCmp(t, ec->order, n) >= 0)
	{
		zzSub2(t, ec->order, n);
		// 2^{l - 1} < q < 2^l, H < 2^l => H - q < q
		ASSERT(wwCmp(t, ec->order, n) < 0);
	}
	zzAddMod(s1, s1, t, ec->order, n);
	// загрузить s0
	wwFrom(s0, id_sig, no / 2);
	s0[n / 2] = 1;
	// belt-hash(oid...)
	beltHashStart(hash_state);
	beltHashStepH(oid_der, oid_len, hash_state);
	// t <- belt-hash(oid || R || H0) mod 2^l
	memCopy(stack, hash_state, beltHash_keep());
	beltHashStepH(id_pubkey, no, stack);
	beltHashStepH(id_hash, no, stack);
	beltHashStepG2((octet*)t, no / 2, stack);
	wwFrom(t, t, no / 2);
	// t1 <- -(t + 2^l)(s0 + 2^l) mod q
	zzMul(t1, t, n / 2, s0, n / 2, stack);
	t1[n] = zzAdd2(t1 + n / 2, t, n / 2);
	t1[n] += zzAdd2(t1 + n / 2, s0, n / 2);
	++t1[n];
	zzMod(t1, t1, n + 1, ec->order, n, stack);
	zzNegMod(t1, t1, ec->order, n);
	// V <- s1 G + (s0 + 2^l) R + t Q
	if (!ecAddMulA(V, ec, stack,
		3, ec->base, s1, n, R, s0, n / 2 + 1, Q, t1, n))
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	qrTo((octet*)V, ecX(V), ec->f, stack);
	// s0 == belt-hash(oid || V || H0 || H) mod 2^l?
	beltHashStepH(V, no, hash_state);
	beltHashStepH(id_hash, no, hash_state);
	beltHashStepH(hash, no, hash_state);
	code = beltHashStepV2(id_sig, no / 2, hash_state) ? ERR_OK : ERR_BAD_SIG;
	// завершение
	blobClose(state);
	return code;
}